

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_14b954f::MachineRunner::stop(MachineRunner *this)

{
  if (this->timer_ != 0) {
    LOCK();
    (this->state_)._M_i = Stopping;
    UNLOCK();
    while ((this->state_)._M_i == Stopping) {
      LOCK();
      (this->frame_lock_).super___atomic_flag_base._M_i = false;
      UNLOCK();
    }
    SDL_RemoveTimer(this->timer_);
    this->timer_ = 0;
  }
  return;
}

Assistant:

void stop() {
		if(timer_) {
			// SDL doesn't define whether SDL_RemoveTimer will block until any pending calls
			// have been completed, or will return instantly. So: do an ordered shutdown,
			// then remove the timer.
			state_ = State::Stopping;
			while(state_ == State::Stopping) {
				frame_lock_.clear();
			}

			SDL_RemoveTimer(timer_);
			timer_ = 0;
		}
	}